

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall
ByteData_HexConstructor_Test::~ByteData_HexConstructor_Test(ByteData_HexConstructor_Test *this)

{
  ByteData_HexConstructor_Test *this_local;
  
  ~ByteData_HexConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteData, HexConstructor) {
  std::string target(
      "123456789012345678901234567890123456789012345678901234567890123456");
  ByteData byte_data = ByteData(target);

  EXPECT_STREQ(byte_data.GetHex().c_str(), target.c_str());
  EXPECT_EQ(byte_data.GetDataSize(), (target.size() / 2));
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "21123456789012345678901234567890123456789012345678901234567890123456");

  EXPECT_EQ(0x12, byte_data.GetHeadData());
  EXPECT_EQ(0x21, byte_data.Serialize().GetHeadData());
}